

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

Abc_Obj_t * Ver_ParseCreatePi(Abc_Ntk_t *pNtk,char *pName)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *extraout_RAX;
  
  pObj = Abc_NtkFindOrCreateNet(pNtk,pName);
  pFanin = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
  Abc_ObjAddFanin(pObj,pFanin);
  return extraout_RAX;
}

Assistant:

Abc_Obj_t * Ver_ParseCreatePi( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet, * pTerm;
    // get the PI net
//    pNet  = Ver_ParseFindNet( pNtk, pName );
//    if ( pNet )
//        printf( "Warning: PI \"%s\" appears twice in the list.\n", pName );
    pNet  = Abc_NtkFindOrCreateNet( pNtk, pName );
    // add the PI node
    pTerm = Abc_NtkCreatePi( pNtk );
    Abc_ObjAddFanin( pNet, pTerm );
    return pTerm;
}